

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::
     __move_merge_adaptive_backward<QList<QGraphicsItem*>::iterator,QGraphicsItem**,QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (ulong *__first1,ulong *__last1,ulong *__first2,ulong *__last2,ulong *__result)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong *puVar4;
  
  if (__first1 == __last1) {
    lVar3 = (long)__last2 - (long)__first2 >> 3;
    if (0 < lVar3) {
      lVar2 = 0;
      do {
        __result[lVar2 + -1] = __last2[lVar2 + -1];
        uVar1 = lVar3 + lVar2;
        lVar2 = lVar2 + -1;
      } while (1 < uVar1);
    }
  }
  else if (__first2 != __last2) {
    __last2 = __last2 + -1;
    do {
      __last1 = __last1 + -1;
      puVar4 = __result;
      while( true ) {
        __result = puVar4 + -1;
        if (*__last2 < *__last1) break;
        *__result = *__last2;
        if (__last2 == __first2) {
          return;
        }
        __last2 = __last2 + -1;
        puVar4 = __result;
      }
      *__result = *__last1;
    } while (__last1 != __first1);
    lVar3 = (long)__last2 + (8 - (long)__first2) >> 3;
    if (0 < lVar3) {
      lVar2 = 0;
      do {
        puVar4[lVar2 + -2] = __last2[lVar2];
        uVar1 = lVar3 + lVar2;
        lVar2 = lVar2 + -1;
      } while (1 < uVar1);
    }
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }